

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Option<Catch::TestRunInfo> * __thiscall
Catch::Option<Catch::TestRunInfo>::operator=
          (Option<Catch::TestRunInfo> *this,Option<Catch::TestRunInfo> *_other)

{
  reset(this);
  if ((string *)_other->nullableValue != (string *)0x0) {
    std::__cxx11::string::string((string *)this->storage,(string *)_other->nullableValue);
    this->nullableValue = (TestRunInfo *)this->storage;
  }
  return this;
}

Assistant:

Option& operator= ( Option const& _other ) {
            reset();
            if( _other )
                nullableValue = new( storage ) T( *_other );
            return *this;
        }